

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGValidateAttribute(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define)

{
  int *piVar1;
  xmlNodePtr pxVar2;
  xmlChar *pxVar3;
  xmlNodePtr pxVar4;
  int iVar5;
  xmlNs *pxVar6;
  xmlChar *pxVar7;
  xmlRelaxNGValidStatePtr pxVar8;
  xmlChar *pxVar9;
  xmlAttrPtr in_RDX;
  xmlAttrPtr extraout_RDX;
  ulong uVar10;
  xmlRelaxNGDefinePtr pxVar11;
  
  pxVar8 = ctxt->state;
  if (pxVar8->nbAttrLeft < 1) {
    return -1;
  }
  if (define->name == (xmlChar *)0x0) {
    if (pxVar8->nbAttrs < 1) {
      return -1;
    }
    uVar10 = 0;
    do {
      pxVar2 = (xmlNodePtr)pxVar8->attrs[uVar10];
      if (pxVar2 != (xmlNodePtr)0x0) {
        iVar5 = xmlRelaxNGAttributeMatch
                          ((xmlRelaxNGValidCtxtPtr)define,(xmlRelaxNGDefinePtr_conflict)pxVar2,
                           in_RDX);
        if (iVar5 == 1) {
          pxVar7 = xmlNodeListGetString(pxVar2->doc,pxVar2->children,1);
          pxVar8 = ctxt->state;
          pxVar4 = pxVar8->seq;
          pxVar3 = pxVar8->value;
          pxVar8->seq = pxVar2;
          pxVar8->value = pxVar7;
          pxVar11 = define->content;
          if (pxVar11 != (xmlRelaxNGDefinePtr)0x0) goto LAB_0017cdc7;
          iVar5 = 0;
          pxVar9 = pxVar7;
          goto LAB_0017ce25;
        }
        pxVar8 = ctxt->state;
        in_RDX = extraout_RDX;
      }
      uVar10 = uVar10 + 1;
      if ((long)pxVar8->nbAttrs <= (long)uVar10) {
        return -1;
      }
    } while( true );
  }
  if (pxVar8->nbAttrs < 1) {
    return -1;
  }
  uVar10 = 0;
  do {
    pxVar2 = (xmlNodePtr)pxVar8->attrs[uVar10];
    if ((pxVar2 != (xmlNodePtr)0x0) && (iVar5 = xmlStrEqual(define->name,pxVar2->name), iVar5 != 0))
    {
      pxVar3 = define->ns;
      if ((pxVar3 == (xmlChar *)0x0) || (*pxVar3 == '\0')) {
        pxVar6 = pxVar2->ns;
        if (pxVar6 != (xmlNs *)0x0) goto LAB_0017ccb8;
LAB_0017cd1b:
        pxVar7 = xmlNodeListGetString(pxVar2->doc,pxVar2->children,1);
        pxVar8 = ctxt->state;
        pxVar4 = pxVar8->seq;
        pxVar3 = pxVar8->value;
        pxVar8->seq = pxVar2;
        pxVar8->value = pxVar7;
        pxVar8->endvalue = (xmlChar *)0x0;
        pxVar11 = define->content;
        if (pxVar11 != (xmlRelaxNGDefinePtr)0x0) goto LAB_0017cd65;
        iVar5 = 0;
        pxVar9 = pxVar7;
        goto LAB_0017cdf0;
      }
      pxVar6 = pxVar2->ns;
      if (pxVar6 != (xmlNs *)0x0) {
LAB_0017ccb8:
        iVar5 = xmlStrEqual(pxVar3,pxVar6->href);
        if (iVar5 != 0) goto LAB_0017cd1b;
      }
    }
    uVar10 = uVar10 + 1;
    pxVar8 = ctxt->state;
    if ((long)pxVar8->nbAttrs <= (long)uVar10) {
      return -1;
    }
  } while( true );
  while (pxVar11 = pxVar11->next, pxVar11 != (xmlRelaxNGDefinePtr)0x0) {
LAB_0017cdc7:
    iVar5 = xmlRelaxNGValidateValue(ctxt,pxVar11);
    if (iVar5 != 0) break;
  }
  pxVar8 = ctxt->state;
  pxVar9 = pxVar8->value;
LAB_0017ce25:
  if (pxVar9 != (xmlChar *)0x0) {
    pxVar7 = pxVar9;
  }
  if (pxVar7 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar7);
    pxVar8 = ctxt->state;
  }
  pxVar8->value = pxVar3;
  pxVar8->seq = pxVar4;
  goto LAB_0017ce53;
  while (pxVar11 = pxVar11->next, pxVar11 != (xmlRelaxNGDefinePtr)0x0) {
LAB_0017cd65:
    iVar5 = xmlRelaxNGValidateValue(ctxt,pxVar11);
    if (iVar5 != 0) break;
  }
  pxVar8 = ctxt->state;
  pxVar9 = pxVar8->value;
LAB_0017cdf0:
  if (pxVar9 != (xmlChar *)0x0) {
    pxVar7 = pxVar9;
  }
  if (pxVar7 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar7);
    pxVar8 = ctxt->state;
  }
  pxVar8->value = pxVar3;
  pxVar8->seq = pxVar4;
LAB_0017ce53:
  if (iVar5 == 0) {
    pxVar8->attrs[uVar10 & 0xffffffff] = (xmlAttrPtr)0x0;
    piVar1 = &ctxt->state->nbAttrLeft;
    *piVar1 = *piVar1 + -1;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int
xmlRelaxNGValidateAttribute(xmlRelaxNGValidCtxtPtr ctxt,
                            xmlRelaxNGDefinePtr define)
{
    int ret = 0, i;
    xmlChar *value, *oldvalue;
    xmlAttrPtr prop = NULL, tmp;
    xmlNodePtr oldseq;

    if (ctxt->state->nbAttrLeft <= 0)
        return (-1);
    if (define->name != NULL) {
        for (i = 0; i < ctxt->state->nbAttrs; i++) {
            tmp = ctxt->state->attrs[i];
            if ((tmp != NULL) && (xmlStrEqual(define->name, tmp->name))) {
                if ((((define->ns == NULL) || (define->ns[0] == 0)) &&
                     (tmp->ns == NULL)) ||
                    ((tmp->ns != NULL) &&
                     (xmlStrEqual(define->ns, tmp->ns->href)))) {
                    prop = tmp;
                    break;
                }
            }
        }
        if (prop != NULL) {
            value = xmlNodeListGetString(prop->doc, prop->children, 1);
            oldvalue = ctxt->state->value;
            oldseq = ctxt->state->seq;
            ctxt->state->seq = (xmlNodePtr) prop;
            ctxt->state->value = value;
            ctxt->state->endvalue = NULL;
            ret = xmlRelaxNGValidateValueContent(ctxt, define->content);
            if (ctxt->state->value != NULL)
                value = ctxt->state->value;
            if (value != NULL)
                xmlFree(value);
            ctxt->state->value = oldvalue;
            ctxt->state->seq = oldseq;
            if (ret == 0) {
                /*
                 * flag the attribute as processed
                 */
                ctxt->state->attrs[i] = NULL;
                ctxt->state->nbAttrLeft--;
            }
        } else {
            ret = -1;
        }
#ifdef DEBUG
        xmlGenericError(xmlGenericErrorContext,
                        "xmlRelaxNGValidateAttribute(%s): %d\n",
                        define->name, ret);
#endif
    } else {
        for (i = 0; i < ctxt->state->nbAttrs; i++) {
            tmp = ctxt->state->attrs[i];
            if ((tmp != NULL) &&
                (xmlRelaxNGAttributeMatch(ctxt, define, tmp) == 1)) {
                prop = tmp;
                break;
            }
        }
        if (prop != NULL) {
            value = xmlNodeListGetString(prop->doc, prop->children, 1);
            oldvalue = ctxt->state->value;
            oldseq = ctxt->state->seq;
            ctxt->state->seq = (xmlNodePtr) prop;
            ctxt->state->value = value;
            ret = xmlRelaxNGValidateValueContent(ctxt, define->content);
            if (ctxt->state->value != NULL)
                value = ctxt->state->value;
            if (value != NULL)
                xmlFree(value);
            ctxt->state->value = oldvalue;
            ctxt->state->seq = oldseq;
            if (ret == 0) {
                /*
                 * flag the attribute as processed
                 */
                ctxt->state->attrs[i] = NULL;
                ctxt->state->nbAttrLeft--;
            }
        } else {
            ret = -1;
        }
#ifdef DEBUG
        if (define->ns != NULL) {
            xmlGenericError(xmlGenericErrorContext,
                            "xmlRelaxNGValidateAttribute(nsName ns = %s): %d\n",
                            define->ns, ret);
        } else {
            xmlGenericError(xmlGenericErrorContext,
                            "xmlRelaxNGValidateAttribute(anyName): %d\n",
                            ret);
        }
#endif
    }

    return (ret);
}